

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CADFile.cpp
# Opt level: O1

void __thiscall CADFile::CADFile(CADFile *this,vector<char,_std::allocator<char>_> *buf)

{
  byte bVar1;
  pointer __src;
  pointer pBVar2;
  size_t __size;
  int iVar3;
  char *buffer;
  undefined8 *puVar4;
  ulong *puVar5;
  long *plVar6;
  size_t __n;
  string *psVar7;
  pointer ppcVar8;
  bool bVar9;
  long *plVar10;
  ulong uVar11;
  char *p;
  vector<char_*,_std::allocator<char_*>_> lines;
  string __str;
  BRDPart part;
  char *arena;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  parts_id;
  long *local_1e0;
  undefined8 local_1d8;
  long local_1d0;
  undefined8 uStack_1c8;
  char *local_1c0;
  CADFile *local_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  undefined8 local_190;
  vector<char_*,_std::allocator<char_*>_> local_188;
  long lStack_170;
  ulong *local_168;
  long local_160;
  ulong local_158 [2];
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8 [2];
  long local_a8 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_98;
  vector<BRDPin,_std::allocator<BRDPin>_> *local_60;
  vector<BRDNail,_std::allocator<BRDNail>_> *local_58;
  char *local_50;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_48;
  pointer local_38;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_0022e3d8;
  uVar11 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_50 = setlocale(1,"C");
  local_1b8 = this;
  if (4 < uVar11) {
    __size = (uVar11 + 1) * 3;
    buffer = (char *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = buffer;
    if (buffer != (char *)0x0) {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(buffer,__src,__n);
      }
      buffer[uVar11] = '\0';
      local_d8 = (long *)(buffer + uVar11 + 1);
      buffer[__size - 1] = '\0';
      local_98._M_buckets = &local_98._M_single_bucket;
      local_98._M_bucket_count = 1;
      local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_98._M_element_count = 0;
      local_98._M_rehash_policy._M_max_load_factor = 1.0;
      local_98._M_rehash_policy._M_next_resize = 0;
      local_98._M_single_bucket = (__node_base_ptr)0x0;
      local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      stringfile(buffer,&local_188);
      bVar9 = false;
      local_38 = local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_1c0 = buffer + (__size - 1);
        local_58 = &(this->super_BRDFileBase).nails;
        local_60 = &(this->super_BRDFileBase).pins;
        local_48 = &(this->super_BRDFileBase).parts;
        bVar9 = true;
        ppcVar8 = local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          plVar10 = (long *)(*ppcVar8 + -1);
          do {
            bVar1 = *(byte *)((long)plVar10 + 1);
            plVar10 = (long *)((long)plVar10 + 1);
            iVar3 = isspace((uint)bVar1);
          } while (iVar3 != 0);
          if (bVar1 != 0) {
            iVar3 = strncmp((char *)plVar10,"COMP",4);
            if (iVar3 == 0) {
              local_190 = 2;
LAB_00142c46:
              local_1e0 = plVar10;
              (*(code *)((long)&DAT_001ee0d8 + (long)(int)(&DAT_001ee0d8)[(int)local_190 - 2]))();
              return;
            }
            iVar3 = strncmp((char *)plVar10,"C_PIN",5);
            if (iVar3 == 0) {
              local_190 = 3;
              goto LAB_00142c46;
            }
            iVar3 = strncmp((char *)plVar10,"NET ",4);
            if (iVar3 == 0) {
              local_190 = 4;
              goto LAB_00142c46;
            }
            iVar3 = strncmp((char *)plVar10,"N_VIA",5);
            if (iVar3 == 0) {
              local_190 = 5;
              goto LAB_00142c46;
            }
            bVar9 = false;
          }
          ppcVar8 = ppcVar8 + 1;
        } while (ppcVar8 != local_38);
        bVar9 = !bVar9;
        this = local_1b8;
      }
      gen_outline(this);
      pBVar2 = (this->super_BRDFileBase).format.
               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (this->super_BRDFileBase).num_parts =
           (int)((ulong)((long)(this->super_BRDFileBase).parts.
                               super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->super_BRDFileBase).parts.
                              super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      (this->super_BRDFileBase).num_pins =
           (int)((ulong)((long)(this->super_BRDFileBase).pins.
                               super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->super_BRDFileBase).pins.
                              super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * -0x49249249;
      (this->super_BRDFileBase).num_format =
           (uint)((ulong)((long)pBVar2 -
                         (long)(this->super_BRDFileBase).format.
                               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      (this->super_BRDFileBase).num_nails =
           (int)((ulong)((long)(this->super_BRDFileBase).nails.
                               super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->super_BRDFileBase).nails.
                              super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      setlocale(1,local_50);
      (this->super_BRDFileBase).valid = bVar9;
      if (local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_98);
      return;
    }
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/CADFile.cpp"
               ,"");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_b8);
    puVar5 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar5) {
      local_138 = *puVar5;
      lStack_130 = plVar10[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *puVar5;
      local_148 = (ulong *)*plVar10;
    }
    local_140 = plVar10[1];
    *plVar10 = (long)puVar5;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_168 = local_158;
    std::__cxx11::string::_M_construct((ulong)&local_168,'\x02');
    *(undefined2 *)local_168 = 0x3434;
    uVar11 = 0xf;
    if (local_148 != &local_138) {
      uVar11 = local_138;
    }
    if (uVar11 < (ulong)(local_160 + local_140)) {
      uVar11 = 0xf;
      if (local_168 != local_158) {
        uVar11 = local_158[0];
      }
      if ((ulong)(local_160 + local_140) <= uVar11) {
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,(ulong)local_148);
        goto LAB_00143f46;
      }
    }
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_168);
LAB_00143f46:
    local_1e0 = &local_1d0;
    plVar10 = puVar4 + 2;
    if ((long *)*puVar4 == plVar10) {
      local_1d0 = *plVar10;
      uStack_1c8 = puVar4[3];
    }
    else {
      local_1d0 = *plVar10;
      local_1e0 = (long *)*puVar4;
    }
    local_1d8 = puVar4[1];
    *puVar4 = plVar10;
    puVar4[1] = 0;
    *(undefined1 *)plVar10 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    local_d8 = &local_c8;
    plVar6 = plVar10 + 2;
    if ((long *)*plVar10 == plVar6) {
      local_c8 = *plVar6;
      lStack_c0 = plVar10[3];
    }
    else {
      local_c8 = *plVar6;
      local_d8 = (long *)*plVar10;
    }
    local_d0 = plVar10[1];
    *plVar10 = (long)plVar6;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    plVar6 = plVar10 + 2;
    if ((pointer *)*plVar10 == (pointer *)plVar6) {
      local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar6;
      lStack_170 = plVar10[3];
    }
    else {
      local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar6;
      local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar10;
    }
    local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)plVar10[1];
    *plVar10 = (long)plVar6;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_188);
    local_1b0 = &local_1a0;
    plVar6 = plVar10 + 2;
    if ((long *)*plVar10 == plVar6) {
      local_1a0 = *plVar6;
      lStack_198 = plVar10[3];
    }
    else {
      local_1a0 = *plVar6;
      local_1b0 = (long *)*plVar10;
    }
    local_1a8 = plVar10[1];
    *plVar10 = (long)plVar6;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1b0);
    plVar6 = plVar10 + 2;
    if ((__node_base *)*plVar10 == (__node_base *)plVar6) {
      local_98._M_before_begin._M_nxt = (_Hash_node_base *)*plVar6;
      local_98._M_element_count = plVar10[3];
      local_98._M_buckets = &local_98._M_before_begin._M_nxt;
    }
    else {
      local_98._M_before_begin._M_nxt = (_Hash_node_base *)*plVar6;
      local_98._M_buckets = (__buckets_ptr)*plVar10;
    }
    local_98._M_bucket_count = plVar10[1];
    *plVar10 = (long)plVar6;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar6 = plVar10 + 2;
    if ((long *)*plVar10 == plVar6) {
      local_118 = *plVar6;
      lStack_110 = plVar10[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar6;
      local_128 = (long *)*plVar10;
    }
    local_120 = plVar10[1];
    *plVar10 = (long)plVar6;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    psVar7 = &(this->super_BRDFileBase).error_msg;
    std::__cxx11::string::operator=((string *)psVar7,(string *)&local_128);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if ((__node_base *)local_98._M_buckets != &local_98._M_before_begin) {
      operator_delete(local_98._M_buckets,
                      (ulong)((long)&(local_98._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    if ((pointer *)
        local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if (local_168 != local_158) {
      operator_delete(local_168,local_158[0] + 1);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    SDL_LogError(1,"%s",(psVar7->_M_dataplus)._M_p);
    return;
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/CADFile.cpp"
             ,"");
  plVar10 = (long *)std::__cxx11::string::append((char *)local_b8);
  puVar5 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar5) {
    local_138 = *puVar5;
    lStack_130 = plVar10[3];
    local_148 = &local_138;
  }
  else {
    local_138 = *puVar5;
    local_148 = (ulong *)*plVar10;
  }
  local_140 = plVar10[1];
  *plVar10 = (long)puVar5;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_168 = local_158;
  std::__cxx11::string::_M_construct((ulong)&local_168,'\x02');
  *(undefined2 *)local_168 = 0x3134;
  uVar11 = 0xf;
  if (local_148 != &local_138) {
    uVar11 = local_138;
  }
  if (uVar11 < (ulong)(local_160 + local_140)) {
    uVar11 = 0xf;
    if (local_168 != local_158) {
      uVar11 = local_158[0];
    }
    if ((ulong)(local_160 + local_140) <= uVar11) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,(ulong)local_148);
      goto LAB_00143b10;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_168);
LAB_00143b10:
  local_1e0 = &local_1d0;
  plVar10 = puVar4 + 2;
  if ((long *)*puVar4 == plVar10) {
    local_1d0 = *plVar10;
    uStack_1c8 = puVar4[3];
  }
  else {
    local_1d0 = *plVar10;
    local_1e0 = (long *)*puVar4;
  }
  local_1d8 = puVar4[1];
  *puVar4 = plVar10;
  puVar4[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  local_d8 = &local_c8;
  plVar6 = plVar10 + 2;
  if ((long *)*plVar10 == plVar6) {
    local_c8 = *plVar6;
    lStack_c0 = plVar10[3];
  }
  else {
    local_c8 = *plVar6;
    local_d8 = (long *)*plVar10;
  }
  local_d0 = plVar10[1];
  *plVar10 = (long)plVar6;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  plVar6 = plVar10 + 2;
  if ((pointer *)*plVar10 == (pointer *)plVar6) {
    local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar6;
    lStack_170 = plVar10[3];
  }
  else {
    local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar6;
    local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar10;
  }
  local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar10[1];
  *plVar10 = (long)plVar6;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_1b0 = &local_1a0;
  plVar6 = plVar10 + 2;
  if ((long *)*plVar10 == plVar6) {
    local_1a0 = *plVar6;
    lStack_198 = plVar10[3];
  }
  else {
    local_1a0 = *plVar6;
    local_1b0 = (long *)*plVar10;
  }
  local_1a8 = plVar10[1];
  *plVar10 = (long)plVar6;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  plVar6 = plVar10 + 2;
  if ((__node_base *)*plVar10 == (__node_base *)plVar6) {
    local_98._M_before_begin._M_nxt = (_Hash_node_base *)*plVar6;
    local_98._M_element_count = plVar10[3];
    local_98._M_buckets = &local_98._M_before_begin._M_nxt;
  }
  else {
    local_98._M_before_begin._M_nxt = (_Hash_node_base *)*plVar6;
    local_98._M_buckets = (__buckets_ptr)*plVar10;
  }
  local_98._M_bucket_count = plVar10[1];
  *plVar10 = (long)plVar6;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_98);
  plVar6 = plVar10 + 2;
  if ((long *)*plVar10 == plVar6) {
    local_118 = *plVar6;
    lStack_110 = plVar10[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *plVar6;
    local_128 = (long *)*plVar10;
  }
  local_120 = plVar10[1];
  *plVar10 = (long)plVar6;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  psVar7 = &(this->super_BRDFileBase).error_msg;
  std::__cxx11::string::operator=((string *)psVar7,(string *)&local_128);
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if ((__node_base *)local_98._M_buckets != &local_98._M_before_begin) {
    operator_delete(local_98._M_buckets,
                    (ulong)((long)&(local_98._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((pointer *)
      local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage) {
    operator_delete(local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  SDL_LogError(1,"%s",(psVar7->_M_dataplus)._M_p);
  return;
}

Assistant:

CADFile::CADFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	float multiplier = 1000.0f;
	char *saved_locale;
	saved_locale  = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	enum Block current_block = None;
	std::unordered_map<std::string, int> parts_id; // map between part name and part number
	char *nailnet; // Net name for VIA

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

			if (!strncmp(line, "COMP", 4)) {
				current_block = Parts;
			} else if (!strncmp(line, "C_PIN", 5)) {
				current_block = Pins;
			} else if (!strncmp(line, "NET ", 4)) {
				current_block = Nets;
			} else if (!strncmp(line, "N_VIA", 5)) {
				current_block = Vias;
			} else {
				current_block = Invalid;
				continue;
			}
		char *p = line;
		char *s;

		switch (current_block) {
			case Parts: {
				BRDPart part;
				BRDPin pin;
				/*char *TYPE    =*/READ_STR();
				part.name       = READ_STR();
				/*char *Part(NR)=*/READ_STR();
				/*char *Unknown =*/READ_STR();
				/*char *Unknown =*/READ_STR();
				/*char *X       =*/READ_STR();
				/*char *Y       =*/READ_STR();
				char *loc       = READ_STR();
				/*int *Unknown  =*/READ_STR();
				part.part_type  = BRDPartType::SMD;
				if (!strcmp(loc, "1"))//top 1 bot 2
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				part.end_of_pins       = 0;
				parts.push_back(part);
				parts_id[part.name] = parts.size();
			} break;
			case Pins: {
				BRDPin pin;
				/*char *TYPE  =*/READ_STR();
				char *part    = READ_STR();
				char *ptr;
				ptr = strchr(part, '-'); //remove all after
				if (ptr != NULL)         //
					{*ptr = '\0';}       //
				pin.part       = parts_id.at(part);
				double posx    = READ_DOUBLE();
				pin.pos.x      = posx * multiplier;
				double posy    = READ_DOUBLE();
				pin.pos.y      = posy * multiplier;
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_STR();
				char *netr     = READ_STR();
				if (strchr(netr, '/'))
					memmove(&netr[0],
					&netr[0 + 1],
					strlen(netr));
				pin.net        = netr;
				switch (parts[pin.part - 1].mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				pins.push_back(pin);
			} break;
			case Nets: {
				/*char *TYPE  =*/READ_STR();
				char *netr     = READ_STR();
				if (strchr(netr, '/'))
					memmove(&netr[0],
					&netr[0 + 1],
					strlen(netr));
				nailnet        = netr;
			} break;
			case Vias: {
				BRDNail nail;
				nail.net     = nailnet;
				/*STR *TYPE  =*/READ_STR();
				double posx  = READ_DOUBLE();
				nail.pos.x   = posx * multiplier;
				double posy  = READ_DOUBLE();
				nail.pos.y   = posy * multiplier;
				/*STR        =*/READ_STR();
				nail.side    = READ_DOUBLE() == 1 ? BRDPartMountingSide::Top : BRDPartMountingSide::Bottom;
				/*double     =*/READ_DOUBLE();
				nails.push_back(nail);
			} break;
			default: continue;
		}
	}
	gen_outline();
	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != None;
}